

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O0

void lgx_rb_del(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  uintptr_t uVar1;
  ulong uVar2;
  lgx_rb_node_t *plVar3;
  bool bVar4;
  lgx_rb_node_t *local_48;
  lgx_rb_node_t *uncle_1;
  lgx_rb_node_t *uncle;
  lgx_rb_node_t *plStack_30;
  lgx_rb_color_t tmp;
  lgx_rb_node_t *x_parent;
  lgx_rb_node_t *x;
  lgx_rb_node_t *y;
  lgx_rb_node_t *node_local;
  lgx_rb_t *rbt_local;
  
  x = node;
  if (node->left == (lgx_rb_node_s *)0x0) {
    x_parent = node->right;
  }
  else if (node->right == (lgx_rb_node_s *)0x0) {
    x_parent = node->left;
  }
  else {
    for (x = node->right; x->left != (lgx_rb_node_s *)0x0; x = x->left) {
    }
    x_parent = x->right;
  }
  if (x == node) {
    plStack_30 = (lgx_rb_node_t *)(x->parent_color & 0xfffffffffffffffc);
    if (x_parent != (lgx_rb_node_t *)0x0) {
      rb_set_parent(x_parent,(lgx_rb_node_t *)(x->parent_color & 0xfffffffffffffffc));
    }
    if (rbt->root == node) {
      rbt->root = x_parent;
    }
    else if (*(lgx_rb_node_t **)(node->parent_color & 0xfffffffffffffffc) == node) {
      *(lgx_rb_node_t **)(node->parent_color & 0xfffffffffffffffc) = x_parent;
    }
    else {
      *(lgx_rb_node_t **)((node->parent_color & 0xfffffffffffffffc) + 8) = x_parent;
    }
  }
  else {
    rb_set_parent(node->left,x);
    x->left = node->left;
    if (x == node->right) {
      plStack_30 = x;
    }
    else {
      plStack_30 = (lgx_rb_node_t *)(x->parent_color & 0xfffffffffffffffc);
      if (x_parent != (lgx_rb_node_t *)0x0) {
        rb_set_parent(x_parent,(lgx_rb_node_t *)(x->parent_color & 0xfffffffffffffffc));
      }
      *(lgx_rb_node_t **)(x->parent_color & 0xfffffffffffffffc) = x_parent;
      x->right = node->right;
      rb_set_parent(node->right,x);
    }
    if (rbt->root == node) {
      rbt->root = x;
    }
    else if (*(lgx_rb_node_t **)(node->parent_color & 0xfffffffffffffffc) == node) {
      *(lgx_rb_node_t **)(node->parent_color & 0xfffffffffffffffc) = x;
    }
    else {
      *(lgx_rb_node_t **)((node->parent_color & 0xfffffffffffffffc) + 8) = x;
    }
    rb_set_parent(x,(lgx_rb_node_t *)(node->parent_color & 0xfffffffffffffffc));
    uVar1 = x->parent_color;
    rb_set_color(x,(lgx_rb_color_t)node->parent_color & LGX_RB_COLOR_BLACK);
    rb_set_color(node,(lgx_rb_color_t)uVar1 & LGX_RB_COLOR_BLACK);
    x = node;
  }
  if ((x->parent_color & 1) != 0) {
    do {
      plVar3 = plStack_30;
      bVar4 = false;
      if ((x_parent != rbt->root) && (bVar4 = true, x_parent != (lgx_rb_node_t *)0x0)) {
        bVar4 = (x_parent->parent_color & 1) != 0;
      }
      if (!bVar4) goto LAB_00139972;
      if (x_parent == plStack_30->left) {
        uncle_1 = plStack_30->right;
        if ((uncle_1->parent_color & 1) == 0) {
          uncle_1->parent_color = uncle_1->parent_color | 1;
          plStack_30->parent_color = plStack_30->parent_color & 0xfffffffffffffffe;
          rb_rotate_left(rbt,plStack_30);
          uncle_1 = plStack_30->right;
        }
        if (((uncle_1->left != (lgx_rb_node_s *)0x0) && ((uncle_1->left->parent_color & 1) == 0)) ||
           ((uncle_1->right != (lgx_rb_node_s *)0x0 && ((uncle_1->right->parent_color & 1) == 0))))
        goto LAB_00139717;
        uncle_1->parent_color = uncle_1->parent_color & 0xfffffffffffffffe;
        uVar2 = plStack_30->parent_color;
      }
      else {
        local_48 = plStack_30->left;
        if ((local_48->parent_color & 1) == 0) {
          local_48->parent_color = local_48->parent_color | 1;
          plStack_30->parent_color = plStack_30->parent_color & 0xfffffffffffffffe;
          rb_rotate_right(rbt,plStack_30);
          local_48 = plStack_30->left;
        }
        if (((local_48->right != (lgx_rb_node_s *)0x0) && ((local_48->right->parent_color & 1) == 0)
            ) || ((local_48->left != (lgx_rb_node_s *)0x0 &&
                  ((local_48->left->parent_color & 1) == 0)))) {
          if ((local_48->left == (lgx_rb_node_s *)0x0) || ((local_48->left->parent_color & 1) != 0))
          {
            if (local_48->right != (lgx_rb_node_s *)0x0) {
              local_48->right->parent_color = local_48->right->parent_color | 1;
            }
            local_48->parent_color = local_48->parent_color & 0xfffffffffffffffe;
            rb_rotate_left(rbt,local_48);
            local_48 = plStack_30->left;
          }
          rb_set_color(local_48,(lgx_rb_color_t)plStack_30->parent_color & LGX_RB_COLOR_BLACK);
          plStack_30->parent_color = plStack_30->parent_color | 1;
          if (local_48->left != (lgx_rb_node_s *)0x0) {
            local_48->left->parent_color = local_48->left->parent_color | 1;
          }
          rb_rotate_right(rbt,plStack_30);
          goto LAB_00139972;
        }
        local_48->parent_color = local_48->parent_color & 0xfffffffffffffffe;
        uVar2 = plStack_30->parent_color;
      }
      plStack_30 = (lgx_rb_node_t *)(uVar2 & 0xfffffffffffffffc);
      x_parent = plVar3;
    } while( true );
  }
LAB_0013998f:
  lgx_str_cleanup(&x->key);
  free(x);
  rbt->size = rbt->size - 1;
  return;
LAB_00139717:
  if ((uncle_1->right == (lgx_rb_node_s *)0x0) || ((uncle_1->right->parent_color & 1) != 0)) {
    if (uncle_1->left != (lgx_rb_node_s *)0x0) {
      uncle_1->left->parent_color = uncle_1->left->parent_color | 1;
    }
    uncle_1->parent_color = uncle_1->parent_color & 0xfffffffffffffffe;
    rb_rotate_right(rbt,uncle_1);
    uncle_1 = plStack_30->right;
  }
  rb_set_color(uncle_1,(lgx_rb_color_t)plStack_30->parent_color & LGX_RB_COLOR_BLACK);
  plStack_30->parent_color = plStack_30->parent_color | 1;
  if (uncle_1->right != (lgx_rb_node_s *)0x0) {
    uncle_1->right->parent_color = uncle_1->right->parent_color | 1;
  }
  rb_rotate_left(rbt,plStack_30);
LAB_00139972:
  if (x_parent != (lgx_rb_node_t *)0x0) {
    x_parent->parent_color = x_parent->parent_color | 1;
  }
  goto LAB_0013998f;
}

Assistant:

void lgx_rb_del(lgx_rb_t * rbt, lgx_rb_node_t * node) {
    lgx_rb_node_t * y = node; // 将要被删除的结点 
    lgx_rb_node_t * x = NULL; // y 的唯一子节点
    lgx_rb_node_t * x_parent = NULL;

    // 这里我们确定了要删除的节点 y，并确定了其唯一字节点 x，注意 x 可能为 NULL
    if (y->left == 0) {             // node has at most one non-null child. y == node.  
        x = y->right;               // x might be null.  
    } else {  
        if (y->right == 0) {        // node has exactly one non-null child.  y == node.  
            x = y->left;            // x is not null.  
        } else {                    // node has two non-null children.  Set y to  
            y = y->right;           //   node's successor.  x might be null.  
            while (y->left != 0) {
                y = y->left;
            }
            x = y->right;
        }
    }

    if (y != node) {                 // relink y in place of z.  y is z's successor  
        // 移动 node 的左子节点，使其成为 y 的左子节点
        rb_set_parent(node->left, y);
        y->left = node->left;

        if (y != node->right) {
            x_parent = rb_parent(y);
            if (x) {
                rb_set_parent(x, rb_parent(y));
            }
            rb_parent(y)->left = x;      // y must be a left child

            y->right = node->right;
            rb_set_parent(node->right, y);
        } else {
            x_parent = y;
        }

        if (rbt->root == node) {
            rbt->root = y;
        } else if (rb_parent(node)->left == node) {
            rb_parent(node)->left = y;
        } else {
            rb_parent(node)->right = y;
        }
        rb_set_parent(y, rb_parent(node));

        // 交换 y 与 node 的颜色
        lgx_rb_color_t tmp = rb_color(y);
        rb_set_color(y, rb_color(node));
        rb_set_color(node, tmp);

        y = node;  
        // y now points to node to be actually deleted  
    } else {                        // y == node
        x_parent = rb_parent(y);  
        if (x) {
            rb_set_parent(x, rb_parent(y));
        }
        if (rbt->root == node) {
            rbt->root = x;  
        } else {
            if (rb_parent(node)->left == node) {
                rb_parent(node)->left = x;  
            } else {
                rb_parent(node)->right = x;
            }
        }
    }

    // 删除黑色结点后，导致黑色缺失，违背性质4,故对树进行调整 
    if( rb_is_black(y) ) {
        while (x != rbt->root && (!x || rb_is_black(x))) {
            if (x == x_parent->left) {
                lgx_rb_node_t* uncle = x_parent->right;
                if(rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_left(rbt, x_parent);  
                    uncle = x_parent->right;  
                }  
                if ((!uncle->left  || rb_is_black(uncle->left)) &&
                    (!uncle->right || rb_is_black(uncle->right))) {
                    rb_set_red(uncle);
                    x = x_parent;
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->right || rb_is_black(uncle->right)) {  
                        if (uncle->left) {
                            rb_set_black(uncle->left);
                        }
                        rb_set_red(uncle);
                        rb_rotate_right(rbt, uncle);
                        uncle = x_parent->right;
                    }
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->right) {
                        rb_set_black(uncle->right);
                    }
                    rb_rotate_left(rbt, x_parent);  
                    break;
                }
            } else {                  // same as above, with right <-> left.  
                lgx_rb_node_t* uncle = x_parent->left;
                if (rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_right(rbt, x_parent);  
                    uncle = x_parent->left;  
                }
                if ((!uncle->right || rb_is_black(uncle->right)) &&  
                    (!uncle->left  || rb_is_black(uncle->left))) {  
                    rb_set_red(uncle);
                    x = x_parent;  
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->left || rb_is_black(uncle->left)) {  
                        if (uncle->right) {
                            rb_set_black(uncle->right);
                        }
                        rb_set_red(uncle);
                        rb_rotate_left(rbt, uncle);  
                        uncle = x_parent->left;  
                    }  
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->left) {
                        rb_set_black(uncle->left);
                    }
                    rb_rotate_right(rbt, x_parent);  
                    break;  
                }  
            }
        }
        if (x) {
            rb_set_black(x);
        }
    }

    /* 删除 y */
    lgx_str_cleanup(&y->key);
    xfree(y);

    rbt->size --;
    
    //lgx_rbtree_print(rbt->root);
    //lgx_log_debug("rbtree delete\n");
}